

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O0

void __thiscall cmCTestTestCommand::cmCTestTestCommand(cmCTestTestCommand *this)

{
  reference ppcVar1;
  cmCTestTestCommand *this_local;
  
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestTestCommand_00b86dd8;
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,8);
  *ppcVar1 = "START";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,9);
  *ppcVar1 = "END";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,10);
  *ppcVar1 = "STRIDE";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0xb);
  *ppcVar1 = "EXCLUDE";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0xc);
  *ppcVar1 = "INCLUDE";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0xd);
  *ppcVar1 = "EXCLUDE_LABEL";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0xe);
  *ppcVar1 = "INCLUDE_LABEL";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0xf);
  *ppcVar1 = "EXCLUDE_FIXTURE";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0x10);
  *ppcVar1 = "EXCLUDE_FIXTURE_SETUP";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0x11);
  *ppcVar1 = "EXCLUDE_FIXTURE_CLEANUP";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0x12);
  *ppcVar1 = "PARALLEL_LEVEL";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0x13);
  *ppcVar1 = "SCHEDULE_RANDOM";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0x14);
  *ppcVar1 = "STOP_TIME";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0x15);
  *ppcVar1 = "TEST_LOAD";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0x16);
  *ppcVar1 = (value_type)0x0;
  (this->super_cmCTestHandlerCommand).Last = 0x16;
  return;
}

Assistant:

cmCTestTestCommand::cmCTestTestCommand()
{
  this->Arguments[ctt_START] = "START";
  this->Arguments[ctt_END] = "END";
  this->Arguments[ctt_STRIDE] = "STRIDE";
  this->Arguments[ctt_EXCLUDE] = "EXCLUDE";
  this->Arguments[ctt_INCLUDE] = "INCLUDE";
  this->Arguments[ctt_EXCLUDE_LABEL] = "EXCLUDE_LABEL";
  this->Arguments[ctt_INCLUDE_LABEL] = "INCLUDE_LABEL";
  this->Arguments[ctt_EXCLUDE_FIXTURE] = "EXCLUDE_FIXTURE";
  this->Arguments[ctt_EXCLUDE_FIXTURE_SETUP] = "EXCLUDE_FIXTURE_SETUP";
  this->Arguments[ctt_EXCLUDE_FIXTURE_CLEANUP] = "EXCLUDE_FIXTURE_CLEANUP";
  this->Arguments[ctt_PARALLEL_LEVEL] = "PARALLEL_LEVEL";
  this->Arguments[ctt_SCHEDULE_RANDOM] = "SCHEDULE_RANDOM";
  this->Arguments[ctt_STOP_TIME] = "STOP_TIME";
  this->Arguments[ctt_TEST_LOAD] = "TEST_LOAD";
  this->Arguments[ctt_LAST] = nullptr;
  this->Last = ctt_LAST;
}